

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

void FILEGetProperNotFoundError(LPSTR lpPath,LPDWORD lpErrorCode)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  undefined8 in_R9;
  LPSTR lpLastPathSeparator;
  LPSTR lpDupedPath;
  stat stat_data;
  LPDWORD lpErrorCode_local;
  LPSTR lpPath_local;
  
  stat_data.__glibc_reserved[2] = (__syscall_slong_t)lpErrorCode;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpErrorCode == (LPDWORD)0x0) {
    fprintf(_stderr,"] %s %s:%d","FILEGetProperNotFoundError",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0xa8,in_R9,0,0);
    fprintf(_stderr,"lpErrorCode has to be valid\n");
  }
  else {
    __s = CorUnix::InternalStrdup(lpPath);
    if (__s == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      *(undefined4 *)stat_data.__glibc_reserved[2] = 8;
    }
    else {
      pcVar2 = strrchr(__s,0x2f);
      if (pcVar2 == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        *(undefined4 *)stat_data.__glibc_reserved[2] = 2;
      }
      else {
        *pcVar2 = '\0';
        if ((*__s == '\0') ||
           ((iVar1 = stat64(__s,(stat64 *)&lpDupedPath), iVar1 == 0 &&
            (((uint)stat_data.st_nlink & 0xf000) == 0x4000)))) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          *(undefined4 *)stat_data.__glibc_reserved[2] = 2;
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          *(undefined4 *)stat_data.__glibc_reserved[2] = 3;
        }
      }
      CorUnix::InternalFree(__s);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return;
}

Assistant:

void FILEGetProperNotFoundError( LPSTR lpPath, LPDWORD lpErrorCode )
{
    struct stat stat_data;
    LPSTR lpDupedPath = NULL;
    LPSTR lpLastPathSeparator = NULL;

    TRACE( "FILEGetProperNotFoundError( %s )\n", lpPath?lpPath:"(null)" );

    if ( !lpErrorCode )
    {
        ASSERT( "lpErrorCode has to be valid\n" );
        return;
    }

    if ( NULL == ( lpDupedPath = InternalStrdup( lpPath ) ) )
    {
        ERROR( "InternalStrdup() failed!\n" );
        *lpErrorCode = ERROR_NOT_ENOUGH_MEMORY;
        return;
    }

    /* Determine whether it's a file not found or path not found. */
    lpLastPathSeparator = strrchr( lpDupedPath, '/');
    if ( lpLastPathSeparator != NULL )
    {
        *lpLastPathSeparator = '\0';
        
        /* If the last path component is a directory,
           we return file not found. If it's a file or
           doesn't exist, we return path not found. */
        if ( '\0' == *lpDupedPath || 
             ( stat( lpDupedPath, &stat_data ) == 0 && 
             ( stat_data.st_mode & S_IFMT ) == S_IFDIR ) )
        {
            TRACE( "ERROR_FILE_NOT_FOUND\n" );
            *lpErrorCode = ERROR_FILE_NOT_FOUND;
        }
        else
        {
            TRACE( "ERROR_PATH_NOT_FOUND\n" );
            *lpErrorCode = ERROR_PATH_NOT_FOUND;
        }
    }
    else
    {
        TRACE( "ERROR_FILE_NOT_FOUND\n" );
        *lpErrorCode = ERROR_FILE_NOT_FOUND;
    }
    
    InternalFree(lpDupedPath);
    lpDupedPath = NULL;
    TRACE( "FILEGetProperNotFoundError returning TRUE\n" );
    return;
}